

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.h
# Opt level: O0

bool __thiscall
llama_model_loader::weight_name_comparer::operator()(weight_name_comparer *this,string *a,string *b)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  int b_layer;
  int a_layer;
  int iVar2;
  int iVar3;
  bool local_1;
  
  iVar3 = -1;
  iVar2 = -1;
  uVar1 = std::__cxx11::string::c_str();
  __isoc99_sscanf(uVar1,"blk.%d.",&stack0xffffffffffffffdc);
  uVar1 = std::__cxx11::string::c_str();
  __isoc99_sscanf(uVar1,"blk.%d.",&stack0xffffffffffffffd8);
  if (iVar3 == iVar2) {
    local_1 = std::operator<(in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(iVar3,iVar2));
  }
  else {
    local_1 = iVar3 < iVar2;
  }
  return local_1;
}

Assistant:

bool operator()(const std::string & a, const std::string & b) const {
            int a_layer = -1;
            int b_layer = -1;
            sscanf(a.c_str(), "blk.%d.", &a_layer);
            sscanf(b.c_str(), "blk.%d.", &b_layer);
            if (a_layer != b_layer) {
                return a_layer < b_layer;
            }
            return a < b;
        }